

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O1

void __thiscall
TTD::ExecutionInfoManager::LoadPreservedBPInfo
          (ExecutionInfoManager *this,ThreadContext *threadContext)

{
  undefined4 uVar1;
  Type ppTVar2;
  ScriptContext *this_00;
  ProbeList *pPVar3;
  Probe *pPVar4;
  FunctionBody *this_01;
  void *pvVar5;
  JsTTDOnBPDeleteCallback p_Var6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  ScriptContext **ppSVar10;
  DebugContext *pDVar11;
  HeapAllocator *this_03;
  TTDebuggerSourceLocation *this_04;
  Type *pTVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  undefined **ppuVar16;
  bool bVar17;
  undefined1 local_c0 [8];
  TrackAllocData data;
  undefined1 local_78 [8];
  List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  bpIdsToDelete;
  ULONG local_38;
  LONG local_34;
  ULONG srcLine;
  LONG srcColumn;
  
  do {
    uVar9 = (ulong)(this->m_unRestoredBreakpoints).
                   super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
                   .count;
    bVar17 = 0 < (long)uVar9;
    if ((long)uVar9 < 1) {
LAB_008f766b:
      if (!bVar17) {
        this_02 = ThreadContextTTD::GetTTDContexts(threadContext->TTDContext);
        if (0 < (this_02->
                super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>).
                count) {
          ppuVar16 = &PTR_IsReadOnly_014faf28;
          iVar15 = 0;
          data._32_8_ = &PTR_IsReadOnly_014faf28;
          do {
            ppSVar10 = JsUtil::
                       ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
                       Item(&this_02->
                             super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                            ,iVar15);
            this_00 = *ppSVar10;
            bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.
            _vptr_ReadOnlyList = (_func_int **)0x0;
            bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.
            buffer._0_4_ = 0;
            bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.
            _16_8_ = &Memory::HeapAllocator::Instance;
            bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.
            alloc = (Type)0x400000000;
            local_78 = (undefined1  [8])ppuVar16;
            pDVar11 = Js::ScriptContext::GetDebugContext(this_00);
            pPVar3 = pDVar11->diagProbesContainer->diagProbeList;
            bpIdsToDelete._44_4_ = iVar15;
            if (0 < (pPVar3->
                    super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count)
            {
              lVar13 = 0;
              do {
                pPVar4 = (pPVar3->
                         super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                         buffer[lVar13];
                if (this->m_activeBPId !=
                    (ulong)*(uint *)&pPVar4[4].super_HaltCallback._vptr_HaltCallback) {
                  this_01 = (FunctionBody *)pPVar4[3].super_HaltCallback._vptr_HaltCallback;
                  uVar8 = Js::FunctionBody::GetEnclosingStatementIndexFromByteCode
                                    (this_01,*(int *)((long)&pPVar4[1].super_HaltCallback.
                                                             _vptr_HaltCallback + 4),false);
                  local_38 = 0;
                  local_34 = -1;
                  uVar8 = Js::FunctionBody::GetStatementStartOffset(this_01,uVar8);
                  Js::FunctionBody::GetSourceLineFromStartOffset_TTD
                            (this_01,uVar8,&local_38,&local_34);
                  local_c0 = (undefined1  [8])&TTDebuggerSourceLocation::typeinfo;
                  data.typeinfo = (type_info *)0x0;
                  data.plusSize = 0xffffffffffffffff;
                  data.count = (size_t)anon_var_dwarf_40e7632;
                  data.filename._0_4_ = 0x336;
                  this_03 = Memory::HeapAllocator::TrackAllocInfo
                                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_c0);
                  this_04 = (TTDebuggerSourceLocation *)
                            Memory::HeapAllocator::AllocT<true>(this_03,0x40);
                  TTDebuggerSourceLocation::TTDebuggerSourceLocation(this_04);
                  if (this_04 == (TTDebuggerSourceLocation *)0x0) {
                    TTDAbort_unrecoverable_error("OOM in TTD");
                  }
                  TTDebuggerSourceLocation::SetLocationWithBP
                            (this_04,(ulong)*(uint *)&pPVar4[4].super_HaltCallback.
                                                      _vptr_HaltCallback,this_01,local_38,local_34);
                  JsUtil::
                  List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::EnsureArray(&this->m_unRestoredBreakpoints,0);
                  iVar15 = (this->m_unRestoredBreakpoints).
                           super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
                           .count;
                  (this->m_unRestoredBreakpoints).
                  super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
                  .buffer[iVar15] = this_04;
                  (this->m_unRestoredBreakpoints).
                  super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
                  .count = iVar15 + 1;
                  uVar1 = *(undefined4 *)&pPVar4[4].super_HaltCallback._vptr_HaltCallback;
                  JsUtil::
                  List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::EnsureArray((List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                 *)local_78,0);
                  *(undefined4 *)
                   ((long)bpIdsToDelete.
                          super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.
                          _vptr_ReadOnlyList +
                   (long)(int)bpIdsToDelete.
                              super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>
                              .buffer * 4) = uVar1;
                  bpIdsToDelete.
                  super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.buffer.
                  _0_4_ = (int)bpIdsToDelete.
                               super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>
                               .buffer + 1;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 < (pPVar3->
                                super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>
                                ).count);
            }
            ppuVar16 = (undefined **)data._32_8_;
            if (0 < (int)bpIdsToDelete.
                         super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.
                         buffer) {
              iVar15 = 0;
              do {
                pvVar5 = (this_00->TTDHostCallbackFunctor).HostRuntime;
                p_Var6 = (this_00->TTDHostCallbackFunctor).pfOnBPDeleteCallback;
                pTVar12 = JsUtil::
                          List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          ::Item((List<unsigned_int,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                  *)local_78,iVar15);
                (*p_Var6)(pvVar5,*pTVar12);
                iVar15 = iVar15 + 1;
              } while (iVar15 < (int)bpIdsToDelete.
                                     super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>
                                     .buffer);
            }
            uVar1 = bpIdsToDelete._44_4_;
            if (bpIdsToDelete._44_4_ ==
                (this_02->
                super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>).
                count + -1) {
              (*(this_00->TTDHostCallbackFunctor).pfOnBPClearDocumentCallback)
                        ((this_00->TTDHostCallbackFunctor).HostRuntime);
            }
            local_78 = (undefined1  [8])ppuVar16;
            if (bpIdsToDelete.
                super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.
                _vptr_ReadOnlyList != (_func_int **)0x0) {
              Memory::HeapAllocator::Free
                        ((HeapAllocator *)
                         bpIdsToDelete.
                         super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>.
                         _16_8_,bpIdsToDelete.
                                super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>
                                ._vptr_ReadOnlyList,
                         (long)(int)bpIdsToDelete.
                                    super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>
                                    .alloc << 2);
              bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>
              ._vptr_ReadOnlyList = (_func_int **)0x0;
              bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>
              .buffer._0_4_ = 0;
              bpIdsToDelete.super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>
              .alloc = (Type)((ulong)bpIdsToDelete.
                                     super_ReadOnlyList<unsigned_int,_Memory::HeapAllocator,_DefaultComparer>
                                     .alloc & 0xffffffff00000000);
            }
            iVar15 = uVar1 + 1;
          } while (iVar15 < (this_02->
                            super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                            ).count);
        }
        return;
      }
    }
    else {
      ppTVar2 = (this->m_unRestoredBreakpoints).
                super_ReadOnlyList<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_DefaultComparer>
                .buffer;
      if (*ppTVar2 != (TTDebuggerSourceLocation *)0x0) {
        uVar7 = 1;
        do {
          uVar14 = uVar7;
          if (uVar9 == uVar14) break;
          uVar7 = uVar14 + 1;
        } while (ppTVar2[uVar14] != (TTDebuggerSourceLocation *)0x0);
        bVar17 = uVar14 < uVar9;
        goto LAB_008f766b;
      }
    }
    local_78 = (undefined1  [8])0x0;
    Js::
    CopyRemovePolicy<JsUtil::List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
    ::Remove((CopyRemovePolicy<JsUtil::List<TTD::TTDebuggerSourceLocation_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
              *)&(this->m_unRestoredBreakpoints).field_0x28,&this->m_unRestoredBreakpoints,
             (TElementType *)local_78);
  } while( true );
}

Assistant:

void ExecutionInfoManager::LoadPreservedBPInfo(ThreadContext* threadContext)
    {
        while(this->m_unRestoredBreakpoints.Contains(nullptr))
        {
            this->m_unRestoredBreakpoints.Remove(nullptr);
        }

        const JsUtil::List<Js::ScriptContext*, HeapAllocator>& ctxs = threadContext->TTDContext->GetTTDContexts();
        for(int32 i = 0; i < ctxs.Count(); ++i)
        {
            Js::ScriptContext* ctx = ctxs.Item(i);
            JsUtil::List<uint32, HeapAllocator> bpIdsToDelete(&HeapAllocator::Instance);

            Js::ProbeContainer* probeContainer = ctx->GetDebugContext()->GetProbeContainer();
            probeContainer->MapProbes([&](int j, Js::Probe* pProbe)
            {
                Js::BreakpointProbe* bp = (Js::BreakpointProbe*)pProbe;
                if((int64)bp->GetId() != this->m_activeBPId)
                {
                    Js::FunctionBody* body = bp->GetFunctionBody();
                    int32 bpIndex = body->GetEnclosingStatementIndexFromByteCode(bp->GetBytecodeOffset());

                    ULONG srcLine = 0;
                    LONG srcColumn = -1;
                    uint32 startOffset = body->GetStatementStartOffset(bpIndex);
                    body->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

                    TTDebuggerSourceLocation* bpLocation = TT_HEAP_NEW(TTDebuggerSourceLocation);
                    bpLocation->SetLocationWithBP(bp->GetId(), body, srcLine, srcColumn);
                    this->m_unRestoredBreakpoints.Add(bpLocation);

                    bpIdsToDelete.Add(bp->GetId());
                }
            });

            for(int32 j = 0; j < bpIdsToDelete.Count(); ++j)
            {
                ctx->TTDHostCallbackFunctor.pfOnBPDeleteCallback(ctx->TTDHostCallbackFunctor.HostRuntime, bpIdsToDelete.Item(j));
            }

            //done with last context so release the debug document dictionary info
            if(i == ctxs.Count() - 1)
            {
                ctx->TTDHostCallbackFunctor.pfOnBPClearDocumentCallback(ctx->TTDHostCallbackFunctor.HostRuntime);
            }
        }
    }